

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O0

void __thiscall Rml::Element::HandleTransitionProperty(Element *this)

{
  code *pcVar1;
  bool bVar2;
  PropertyId id;
  ComputedValues *this_00;
  iterator iVar3;
  iterator iVar4;
  int *__pred;
  pointer this_01;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_90;
  const_iterator local_88;
  const_iterator local_80;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_78;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_70;
  iterator it;
  Vector<Transition> *keep_transitions_list;
  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
  local_20;
  iterator it_remove;
  TransitionList *keep_transitions;
  Element *this_local;
  
  if (((byte)this->field_0x17 >> 4 & 1) != 0) {
    this->field_0x17 = this->field_0x17 & 0xef;
    this_00 = GetComputedValues(this);
    it_remove._M_current = (ElementAnimation *)Style::ComputedValues::transition(this_00);
    if ((it_remove._M_current == (ElementAnimation *)0x0) ||
       (((it_remove._M_current)->field_0x1 & 1) == 0)) {
      local_20._M_current =
           (ElementAnimation *)
           ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                     (&this->animations);
      if ((it_remove._M_current == (ElementAnimation *)0x0) ||
         (((it_remove._M_current)->property_id & MarginTop) != Invalid)) {
        iVar3 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::begin
                          (&this->animations);
        iVar4 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                          (&this->animations);
        local_20 = ::std::
                   partition<__gnu_cxx::__normal_iterator<Rml::ElementAnimation*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>,Rml::Element::HandleTransitionProperty()::__0>
                             (iVar3._M_current,iVar4._M_current);
      }
      else {
        if ((it_remove._M_current == (ElementAnimation *)0x0) &&
           (bVar2 = Assert("RMLUI_ASSERT(keep_transitions)",
                           "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Element.cpp"
                           ,0xa6e), !bVar2)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        __pred = &(it_remove._M_current)->num_iterations;
        iVar3 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::begin
                          (&this->animations);
        iVar4 = ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                          (&this->animations);
        it._M_current = (ElementAnimation *)__pred;
        local_20 = ::std::
                   partition<__gnu_cxx::__normal_iterator<Rml::ElementAnimation*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>,Rml::Element::HandleTransitionProperty()::__1>
                             (iVar3._M_current,iVar4._M_current,(anon_class_8_1_d334f119)__pred);
      }
      local_70._M_current = local_20._M_current;
      while( true ) {
        local_78._M_current =
             (ElementAnimation *)
             ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                       (&this->animations);
        bVar2 = __gnu_cxx::operator!=(&local_70,&local_78);
        if (!bVar2) break;
        this_01 = __gnu_cxx::
                  __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
                  ::operator->(&local_70);
        id = ElementAnimation::GetPropertyId(this_01);
        RemoveProperty(this,id);
        __gnu_cxx::
        __normal_iterator<Rml::ElementAnimation_*,_std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>_>
        ::operator++(&local_70);
      }
      __gnu_cxx::
      __normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
      ::__normal_iterator<Rml::ElementAnimation*>
                ((__normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
                  *)&local_80,&local_20);
      local_90._M_current =
           (ElementAnimation *)
           ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::end
                     (&this->animations);
      __gnu_cxx::
      __normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
      ::__normal_iterator<Rml::ElementAnimation*>
                ((__normal_iterator<Rml::ElementAnimation_const*,std::vector<Rml::ElementAnimation,std::allocator<Rml::ElementAnimation>>>
                  *)&local_88,&local_90);
      ::std::vector<Rml::ElementAnimation,_std::allocator<Rml::ElementAnimation>_>::erase
                (&this->animations,local_80,local_88);
    }
  }
  return;
}

Assistant:

void Element::HandleTransitionProperty()
{
	if (dirty_transition)
	{
		dirty_transition = false;

		// Remove all transitions that are no longer in our local list
		const TransitionList* keep_transitions = GetComputedValues().transition();

		if (keep_transitions && keep_transitions->all)
			return;

		auto it_remove = animations.end();

		if (!keep_transitions || keep_transitions->none)
		{
			// All transitions should be removed, but only touch the animations that originate from the 'transition' property.
			// Move all animations to be erased in a valid state at the end of the list, and erase later.
			it_remove = std::partition(animations.begin(), animations.end(),
				[](const ElementAnimation& animation) -> bool { return !animation.IsTransition(); });
		}
		else
		{
			RMLUI_ASSERT(keep_transitions);

			// Only remove the transitions that are not in our keep list.
			const auto& keep_transitions_list = keep_transitions->transitions;

			it_remove = std::partition(animations.begin(), animations.end(), [&keep_transitions_list](const ElementAnimation& animation) -> bool {
				if (!animation.IsTransition())
					return true;
				auto it = std::find_if(keep_transitions_list.begin(), keep_transitions_list.end(),
					[&animation](const Transition& transition) { return animation.GetPropertyId() == transition.id; });
				bool keep_animation = (it != keep_transitions_list.end());
				return keep_animation;
			});
		}

		// We can decide what to do with cancelled transitions here.
		for (auto it = it_remove; it != animations.end(); ++it)
			RemoveProperty(it->GetPropertyId());

		animations.erase(it_remove, animations.end());
	}
}